

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_get_device_info__jack
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  ma_result resultCode;
  undefined4 uVar1;
  long lVar2;
  uint uVar3;
  char **ppPorts;
  ma_jack_client_t *pmStack_40;
  ma_result result;
  ma_jack_client_t *pClient;
  ma_device_info *pDeviceInfo_local;
  ma_device_id *pmStack_28;
  ma_share_mode shareMode_local;
  ma_device_id *pDeviceID_local;
  ma_context *pmStack_18;
  ma_device_type deviceType_local;
  ma_context *pContext_local;
  
  pClient = (ma_jack_client_t *)pDeviceInfo;
  pDeviceInfo_local._4_4_ = shareMode;
  pmStack_28 = pDeviceID;
  pDeviceID_local._4_4_ = deviceType;
  pmStack_18 = pContext;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x50d9,
                  "ma_result ma_context_get_device_info__jack(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
                 );
  }
  if (shareMode == ma_share_mode_exclusive) {
    pContext_local._4_4_ = -0x66;
  }
  else if ((pDeviceID == (ma_device_id *)0x0) || (pDeviceID->wasapi[0] == L'\0')) {
    if (deviceType == ma_device_type_playback) {
      ma_strncpy_s(pDeviceInfo->name,0x100,"Default Playback Device",0xffffffffffffffff);
    }
    else {
      ma_strncpy_s(pDeviceInfo->name,0x100,"Default Capture Device",0xffffffffffffffff);
    }
    *(undefined4 *)(pClient + 0x200) = 1;
    *(undefined4 *)(pClient + 0x204) = 5;
    resultCode = ma_context_open_client__jack(pmStack_18,&stack0xffffffffffffffc0);
    if (resultCode == 0) {
      uVar1 = (*(pmStack_18->field_21).alsa.snd_pcm_hw_params_get_format_mask)(pmStack_40);
      *(undefined4 *)(pClient + 0x224) = uVar1;
      *(undefined4 *)(pClient + 0x228) = *(undefined4 *)(pClient + 0x224);
      *(undefined4 *)(pClient + 0x21c) = 0;
      *(undefined4 *)(pClient + 0x220) = 0;
      uVar3 = 2;
      if (pDeviceID_local._4_4_ == ma_device_type_playback) {
        uVar3 = 1;
      }
      lVar2 = (*(pmStack_18->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                        (pmStack_40,0,"32 bit float mono audio",(long)(int)(uVar3 | 4));
      if (lVar2 == 0) {
        (*(pmStack_18->field_21).alsa.snd_pcm_close)(pmStack_40);
        pContext_local._4_4_ =
             ma_context_post_error
                       (pmStack_18,(ma_device *)0x0,1,"[JACK] Failed to query physical ports.",
                        -0x12d);
      }
      else {
        while (*(long *)(lVar2 + (ulong)*(uint *)(pClient + 0x21c) * 8) != 0) {
          *(int *)(pClient + 0x21c) = *(int *)(pClient + 0x21c) + 1;
          *(int *)(pClient + 0x220) = *(int *)(pClient + 0x220) + 1;
        }
        (*(pmStack_18->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar2);
        (*(pmStack_18->field_21).alsa.snd_pcm_close)(pmStack_40);
        pContext_local._4_4_ = 0;
      }
    }
    else {
      pContext_local._4_4_ =
           ma_context_post_error
                     (pmStack_18,(ma_device *)0x0,1,"[JACK] Failed to open client.",resultCode);
    }
  }
  else {
    pContext_local._4_4_ = -0x68;
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_context_get_device_info__jack(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_jack_client_t* pClient;
    ma_result result;
    const char** ppPorts;

    MA_ASSERT(pContext != NULL);

    /* No exclusive mode with the JACK backend. */
    if (shareMode == ma_share_mode_exclusive) {
        return MA_SHARE_MODE_NOT_SUPPORTED;
    }

    if (pDeviceID != NULL && pDeviceID->jack != 0) {
        return MA_NO_DEVICE;   /* Don't know the device. */
    }

    /* Name / Description */
    if (deviceType == ma_device_type_playback) {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
    } else {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
    }

    /* Jack only supports f32 and has a specific channel count and sample rate. */
    pDeviceInfo->formatCount = 1;
    pDeviceInfo->formats[0] = ma_format_f32;

    /* The channel count and sample rate can only be determined by opening the device. */
    result = ma_context_open_client__jack(pContext, &pClient);
    if (result != MA_SUCCESS) {
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[JACK] Failed to open client.", result);
    }

    pDeviceInfo->minSampleRate = ((ma_jack_get_sample_rate_proc)pContext->jack.jack_get_sample_rate)((ma_jack_client_t*)pClient);
    pDeviceInfo->maxSampleRate = pDeviceInfo->minSampleRate;

    pDeviceInfo->minChannels = 0;
    pDeviceInfo->maxChannels = 0;

    ppPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ((deviceType == ma_device_type_playback) ? ma_JackPortIsInput : ma_JackPortIsOutput));
    if (ppPorts == NULL) {
        ((ma_jack_client_close_proc)pContext->jack.jack_client_close)((ma_jack_client_t*)pClient);
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[JACK] Failed to query physical ports.", MA_FAILED_TO_OPEN_BACKEND_DEVICE);
    }

    while (ppPorts[pDeviceInfo->minChannels] != NULL) {
        pDeviceInfo->minChannels += 1;
        pDeviceInfo->maxChannels += 1;
    }

    ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppPorts);
    ((ma_jack_client_close_proc)pContext->jack.jack_client_close)((ma_jack_client_t*)pClient);

    (void)pContext;
    return MA_SUCCESS;
}